

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_dse_ustore(jit_State *J)

{
  IRIns *pIVar1;
  IRRef1 IVar2;
  ushort uVar3;
  IRIns *pIVar4;
  uint uVar5;
  AliasRet AVar6;
  TRef TVar7;
  IRIns *local_68;
  IRIns *obar;
  IRRef1 *bp;
  IRIns *ir;
  IRIns *store;
  IRRef1 *pIStack_40;
  IRRef ref;
  IRRef1 *refp;
  IRIns *xr;
  IRRef val;
  IRRef xref;
  jit_State *J_local;
  
  uVar5 = (uint)(J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  pIVar4 = (J->cur).ir;
  pIStack_40 = J->chain + 0x4c;
  uVar3 = *pIStack_40;
  while (store._4_4_ = (uint)uVar3, uVar5 < store._4_4_) {
    pIVar1 = (J->cur).ir + store._4_4_;
    AVar6 = aa_uref(pIVar4 + uVar5,(J->cur).ir + (pIVar1->field_0).op1);
    if (AVar6 != ALIAS_NO) {
      if (AVar6 == ALIAS_MAY) {
        if ((pIVar1->field_0).op2 != IVar2) break;
      }
      else if (AVar6 == ALIAS_MUST) {
        if ((pIVar1->field_0).op2 == IVar2) {
          return 4;
        }
        if (J->chain[0x11] < store._4_4_) {
          bp = (IRRef1 *)((J->cur).ir + ((J->cur).nins - 1));
          goto LAB_001418e3;
        }
        break;
      }
    }
    pIStack_40 = &(pIVar1->field_0).prev;
    uVar3 = (pIVar1->field_0).prev;
  }
LAB_00141a4d:
  TVar7 = lj_ir_emit(J);
  return TVar7;
LAB_001418e3:
  if (bp <= pIVar1) goto LAB_00141914;
  if ((bp[2] & 0x80) != 0) goto LAB_00141a4d;
  bp = bp + -4;
  goto LAB_001418e3;
LAB_00141914:
  *pIStack_40 = (pIVar1->field_0).prev;
  (pIVar1->field_0).ot = 0xc00;
  (pIVar1->field_0).op2 = 0;
  (pIVar1->field_0).op1 = 0;
  (pIVar1->field_0).prev = 0;
  if (((store._4_4_ + 1 < (J->cur).nins) && (*(char *)((long)pIVar1 + 0xd) == 'Y')) &&
     (pIVar1[1].field_0.op1 == uVar5)) {
    obar = (IRIns *)(J->chain + 0x59);
    local_68 = (J->cur).ir + (obar->field_0).op1;
    while (store._4_4_ + 1 < (uint)(obar->field_0).op1) {
      obar = (IRIns *)&(local_68->field_0).prev;
      local_68 = (J->cur).ir + (obar->field_0).op1;
    }
    (obar->field_0).op1 = (local_68->field_0).prev;
    (local_68->field_0).ot = 0xc00;
    (local_68->field_0).op2 = 0;
    (local_68->field_0).op1 = 0;
    (local_68->field_0).prev = 0;
  }
  goto LAB_00141a4d;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ustore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[IR_USTORE];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads). */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	if (ref+1 < J->cur.nins &&
	    store[1].o == IR_OBAR && store[1].op1 == xref) {
	  IRRef1 *bp = &J->chain[IR_OBAR];
	  IRIns *obar;
	  for (obar = IR(*bp); *bp > ref+1; obar = IR(*bp))
	    bp = &obar->prev;
	  /* Remove OBAR, too. */
	  *bp = obar->prev;
	  lj_ir_nop(obar);
	}
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}